

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::Matchers::Floating::WithinUlpsMatcher::WithinUlpsMatcher
          (WithinUlpsMatcher *this,double target,uint64_t ulps,FloatingPointKind baseType)

{
  undefined7 in_register_00000011;
  string local_58;
  ReusableStringStream local_38;
  
  (this->super_MatcherBase<double>).super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)&(this->super_MatcherBase<double>).super_MatcherUntypedBase.m_cachedToString.field_2
  ;
  (this->super_MatcherBase<double>).super_MatcherUntypedBase.m_cachedToString._M_string_length = 0;
  (this->super_MatcherBase<double>).super_MatcherUntypedBase.m_cachedToString.field_2._M_local_buf
  [0] = '\0';
  (this->super_MatcherBase<double>).super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)&PTR__MatcherUntypedBase_00236b30;
  (this->super_MatcherBase<double>).super_MatcherMethod<double>._vptr_MatcherMethod =
       (_func_int **)&DAT_00236b60;
  this->m_target = target;
  this->m_ulps = ulps;
  this->m_type = baseType;
  if (ulps < 0xffffffff || (int)CONCAT71(in_register_00000011,baseType) == 1) {
    return;
  }
  ReusableStringStream::ReusableStringStream(&local_38);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_38.m_oss,"Provided ULP is impossibly large for a float comparison.",
             0x38);
  std::__cxx11::stringbuf::str();
  throw_domain_error(&local_58);
}

Assistant:

WithinUlpsMatcher::WithinUlpsMatcher(double target, uint64_t ulps, FloatingPointKind baseType)
                :m_target{ target }, m_ulps{ ulps }, m_type{ baseType } {
                CATCH_ENFORCE(m_type == FloatingPointKind::Double
                    || m_ulps < (std::numeric_limits<uint32_t>::max)(),
                    "Provided ULP is impossibly large for a float comparison.");
            }